

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O0

int __thiscall
pstore::brokerface::channel<pstore::descriptor_condition_variable>::remove
          (channel<pstore::descriptor_condition_variable> *this,char *__filename)

{
  bool bVar1;
  int extraout_EAX;
  _Node_iterator_base<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_false>
  local_30;
  _Node_iterator_base<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_false>
  local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  subscriber_type *sub_local;
  channel<pstore::descriptor_condition_variable> *this_local;
  
  lock._M_device = (mutex_type *)__filename;
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)this);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_std::hash<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>_>
       ::find((unordered_set<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_std::hash<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>_>
               *)(this + 0x30),(key_type *)&lock);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_std::hash<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>_>
       ::end((unordered_set<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_std::hash<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>_>
              *)(this + 0x30));
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (!bVar1) {
    assert_failed("subscribers_.find (sub) != subscribers_.end ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/brokerface/pubsub.hpp"
                  ,0x130);
  }
  std::
  unordered_set<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_std::hash<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>_>
  ::erase((unordered_set<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*,_std::hash<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::equal_to<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>,_std::allocator<pstore::brokerface::subscriber<pstore::descriptor_condition_variable>_*>_>
           *)(this + 0x30),(key_type *)&lock);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return extraout_EAX;
}

Assistant:

void channel<ConditionVariable>::remove (subscriber_type * sub) noexcept {
            std::lock_guard<std::mutex> const lock{mut_};
            PSTORE_ASSERT (subscribers_.find (sub) != subscribers_.end ());
            subscribers_.erase (sub);
        }